

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesglobaltypes.cpp
# Opt level: O0

bool __thiscall StimulationCommand::setGroup(StimulationCommand *this,int groupNum)

{
  int groupNum_local;
  StimulationCommand *this_local;
  bool local_1;
  
  if (groupNum < 0x20) {
    if (groupNum < 0) {
      local_1 = false;
    }
    else {
      this->_group = (byte)groupNum & 0x1f;
      this->_group = this->_group | 0x80;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool StimulationCommand::setGroup(int groupNum) {
//    std::cerr << "set group " << groupNum << "\n";
    //Set the trigger group. Multiple slots can belong to the same trigger group, and can be triggered together.
    //bits 4-0 has the group number (up to 31), bit 5=0, bit 6=0, bit 7 has trigger enable)
    if (groupNum > 31) return false;
    if (groupNum < 0) return false;

    _group = 0x1F & groupNum; //set bits 0-4 to the group number
    _group |= 0x80; //set bit 7 to 1

    return true;

}